

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::Invoke
          (FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
           *this,vector<char,_std::allocator<char>_> *args,unsigned_long args_1)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  local_38;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  holder;
  ArgumentTuple tuple;
  unsigned_long args_local_1;
  vector<char,_std::allocator<char>_> *args_local;
  FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *this_local
  ;
  
  tuple.super__Tuple_impl<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long>.
  super__Head_base<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_false>._M_head_impl =
       (vector<char,_std::allocator<char>_> *)args_1;
  std::tuple<const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long>::
  tuple<const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long,_true>
            ((tuple<const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long> *)&holder,args,
             (unsigned_long *)
             &tuple.
              super__Tuple_impl<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long>
              .super__Head_base<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_false>);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (tuple<const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long> *)&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<void>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
              *)&local_38,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
            ::operator->(&local_38);
  ActionResultHolder<void>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  ::~unique_ptr(&local_38);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }